

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

TestCaseProperties __thiscall
Catch::anon_unknown_26::parseSpecialTag(anon_unknown_26 *this,StringRef tag)

{
  TestCaseProperties TVar1;
  int iVar2;
  char *__n;
  
  __n = tag.m_start;
  if (__n == (char *)0x0) {
LAB_00140b37:
    TVar1 = None;
  }
  else {
    if (*this == (anon_unknown_26)0x2e) {
      return IsHidden;
    }
    TVar1 = None;
    switch(__n) {
    case (char *)0x7:
      iVar2 = bcmp(this,"!throws",(size_t)__n);
      if (iVar2 == 0) {
        return Throws;
      }
      TVar1 = None;
      switch(__n) {
      case (char *)0x8:
        goto switchD_00140a71_caseD_8;
      default:
        goto switchD_00140a71_caseD_9;
      case (char *)0xa:
        break;
      case (char *)0xb:
        goto switchD_00140a71_caseD_b;
      case (char *)0xc:
        goto switchD_00140a71_caseD_c;
      }
    case (char *)0x8:
switchD_00140a71_caseD_8:
      iVar2 = bcmp(this,"!mayfail",(size_t)__n);
      if (iVar2 == 0) {
        return MayFail;
      }
      if (__n != (char *)0xa) {
        if (__n != (char *)0xc) goto LAB_00140b37;
        goto switchD_00140a71_caseD_c;
      }
      break;
    default:
      goto switchD_00140a71_caseD_9;
    case (char *)0xa:
      break;
    case (char *)0xb:
switchD_00140a71_caseD_b:
      iVar2 = bcmp(this,"!shouldfail",(size_t)__n);
      if (iVar2 == 0) {
        return ShouldFail;
      }
      if (__n == (char *)0xc) goto switchD_00140a71_caseD_c;
      if (__n != (char *)0xa) {
        if (__n != (char *)0x8) goto LAB_00140b37;
        goto switchD_00140a71_caseD_8;
      }
      break;
    case (char *)0xc:
switchD_00140a71_caseD_c:
      iVar2 = bcmp(this,"!nonportable",(size_t)__n);
      if (iVar2 == 0) {
        return NonPortable;
      }
      if (__n != (char *)0xa) goto LAB_00140b37;
    }
    iVar2 = bcmp(this,"!benchmark",(size_t)__n);
    TVar1 = Benchmark|IsHidden;
    if (iVar2 != 0) {
      TVar1 = None;
    }
  }
switchD_00140a71_caseD_9:
  return TVar1;
}

Assistant:

TestCaseProperties parseSpecialTag( StringRef tag ) {
            if( !tag.empty() && tag[0] == '.' )
                return TestCaseProperties::IsHidden;
            else if( tag == "!throws"_sr )
                return TestCaseProperties::Throws;
            else if( tag == "!shouldfail"_sr )
                return TestCaseProperties::ShouldFail;
            else if( tag == "!mayfail"_sr )
                return TestCaseProperties::MayFail;
            else if( tag == "!nonportable"_sr )
                return TestCaseProperties::NonPortable;
            else if( tag == "!benchmark"_sr )
                return TestCaseProperties::Benchmark | TestCaseProperties::IsHidden;
            else
                return TestCaseProperties::None;
        }